

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void change_priority_level(Am_Object *inter,bool from_running,bool to_running)

{
  Am_Value *this;
  undefined4 local_18;
  float current_priority;
  bool to_running_local;
  bool from_running_local;
  Am_Object *inter_local;
  
  this = Am_Object::Get(inter,0xcd,0);
  local_18 = Am_Value::operator_cast_to_float(this);
  if (from_running) {
    local_18 = local_18 - 100.0;
  }
  if (to_running) {
    local_18 = local_18 + 100.0;
  }
  Am_Object::Set(inter,0xcd,local_18,0);
  return;
}

Assistant:

static void
change_priority_level(Am_Object &inter, bool from_running, bool to_running)
{
  float current_priority = inter.Get(Am_PRIORITY);
  if (from_running)
    current_priority = current_priority - Am_INTER_PRIORITY_DIFF;
  if (to_running)
    current_priority = current_priority + Am_INTER_PRIORITY_DIFF;
  inter.Set(Am_PRIORITY, current_priority);
  // Setting the priority should invoke the formula above:
  // maintain_inter_to_window_list_priority, which will adjust the interactor
  // in the window's inter_list.
}